

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

GCproto * fs_finish(LexState *ls,BCLine line)

{
  uint8_t *puVar1;
  SBuf *sb;
  MSize sz;
  uint uVar2;
  int iVar3;
  BCPos BVar4;
  FuncState *fs;
  lua_State *L;
  VarInfo *pVVar5;
  uint64_t uVar6;
  char *pcVar7;
  BCInsLine *pBVar8;
  GCtab *pGVar9;
  TValue *pTVar10;
  uint uVar11;
  uint uVar12;
  BCPos BVar13;
  GCobj *o;
  ptrdiff_t argbase;
  byte bVar14;
  byte bVar15;
  long lVar16;
  VarInfo *pVVar17;
  int iVar18;
  uint *puVar19;
  ulong uVar20;
  ulong uVar21;
  ushort uVar22;
  void *__dest;
  TValue *pTVar23;
  uint sz_00;
  ulong __n;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  char *pcVar28;
  GCobj *v;
  
  fs = ls->fs;
  uVar24 = line - fs->linedefined;
  L = ls->L;
  uVar2 = fs->pc;
  if (((uVar2 <= fs->lasttarget) || (uVar11 = (byte)fs->bcbase[uVar2 - 1].ins - 0x43, 9 < uVar11))
     || ((0x3c3U >> (uVar11 & 0x1f) & 1) == 0)) {
    if ((fs->bl->flags & 8) != 0) {
      bcemit_INS(fs,0x80000032);
    }
    bcemit_INS(fs,0x1004b);
  }
  puVar1 = &fs->bl->flags;
  *puVar1 = *puVar1 | 0x10;
  fscope_end(fs);
  if ((fs->flags & 0x40) != 0) {
    iVar18 = 0x7ffe;
    for (uVar27 = 1; uVar27 < uVar2; uVar27 = uVar27 + 1) {
      uVar11 = fs->bcbase[uVar27].ins;
      uVar12 = (uVar11 & 0xff) - 0x32;
      if (uVar12 < 0x1b) {
        if ((0x7860000U >> (uVar12 & 0x1f) & 1) == 0) {
          if (uVar12 == 0) break;
        }
        else {
          BVar13 = bcemit_INS(fs,uVar11);
          pBVar8 = fs->bcbase;
          pBVar8[BVar13].line = pBVar8[uVar27].line;
          if (0xffff < BVar13 + iVar18) {
            err_syntax(fs->ls,LJ_ERR_XFIXUP);
          }
          pBVar8[uVar27].ins = (BVar13 + iVar18) * 0x10000 | 0x32;
        }
      }
      iVar18 = iVar18 + -1;
    }
  }
  uVar2 = fs->pc;
  uVar11 = fs->nkn;
  uVar12 = fs->nkgc;
  bVar15 = fs->nuv;
  uVar27 = (ulong)((uint)bVar15 * 2 + 2 & 0xfffffffc);
  bVar14 = 2 - (uVar24 < 0x10000);
  uVar25 = 0;
  if ((int)uVar24 < 0x100) {
    bVar14 = 0;
  }
  pcVar28 = (ls->sb).b;
  pVVar5 = ls->vstack;
  sb = &ls->sb;
  (ls->sb).w = pcVar28;
  for (; bVar15 != uVar25; uVar25 = uVar25 + 1) {
    uVar6 = pVVar5[fs->uvmap[uVar25]].name.gcptr64;
    sz_00 = *(int *)(uVar6 + 0x14) + 1;
    if ((uint)(*(int *)&(ls->sb).e - (int)pcVar28) < sz_00) {
      pcVar28 = lj_buf_more2(sb,sz_00);
    }
    memcpy(pcVar28,(void *)(uVar6 + 0x18),(ulong)sz_00);
    pcVar28 = pcVar28 + sz_00;
    sb->w = pcVar28;
  }
  uVar20 = (ulong)uVar12 * 8 + (ulong)uVar2 * 4 + 0x6f & 0xffffffff8;
  lVar16 = (ulong)uVar11 * 8 + uVar20;
  uVar25 = (long)pcVar28 - (long)(ls->sb).b;
  uVar11 = ls->vtop;
  BVar13 = 0;
  for (pVVar17 = pVVar5 + fs->vbase; iVar18 = (int)pcVar28, pVVar17 < pVVar5 + uVar11;
      pVVar17 = pVVar17 + 1) {
    if ((pVVar17->info & 6) == 0) {
      uVar21 = (pVVar17->name).gcptr64;
      if (uVar21 < 7) {
        if ((uint)(*(int *)&(ls->sb).e - iVar18) < 0xb) {
          pcVar28 = lj_buf_more2(sb,0xb);
        }
        *pcVar28 = (char)uVar21;
        pcVar28 = pcVar28 + 1;
      }
      else {
        iVar3 = *(int *)(uVar21 + 0x14);
        sz = iVar3 + 0xb;
        if ((uint)(*(int *)&(ls->sb).e - iVar18) < sz) {
          pcVar28 = lj_buf_more2(sb,sz);
        }
        __n = (ulong)(iVar3 + 1);
        memcpy(pcVar28,(void *)(uVar21 + 0x18),__n);
        pcVar28 = pcVar28 + __n;
      }
      BVar4 = pVVar17->startpc;
      pcVar28 = lj_strfmt_wuleb128(pcVar28,BVar4 - BVar13);
      pcVar28 = lj_strfmt_wuleb128(pcVar28,pVVar17->endpc - BVar4);
      sb->w = pcVar28;
      BVar13 = BVar4;
    }
  }
  lVar26 = (ulong)(uVar2 - 1 << (bVar14 & 0x1f)) + uVar27 + lVar16;
  if (*(int *)&(ls->sb).e == iVar18) {
    pcVar28 = lj_buf_more2(sb,1);
  }
  *pcVar28 = '\0';
  pcVar28 = pcVar28 + 1;
  (ls->sb).w = pcVar28;
  pcVar7 = (ls->sb).b;
  o = (GCobj *)lj_mem_newgco(L,(ulong)(pcVar28 + (lVar26 - (long)pcVar7)) & 0xffffffff);
  (o->gch).gct = '\a';
  (o->pt).sizept = (MSize)(pcVar28 + (lVar26 - (long)pcVar7));
  (o->pt).trace = 0;
  bVar15 = fs->flags;
  (o->pt).flags = bVar15 & 0x9f;
  (o->gch).unused1 = fs->numparams;
  bVar14 = fs->framesize;
  (o->gch).unused2 = bVar14;
  (o->th).openupval.gcptr64 = (uint64_t)ls->chunkname;
  pTVar23 = (TValue *)(uVar20 + (long)o);
  pTVar23[-(ulong)(fs->nkgc + 1)].field_4.i = 0;
  uVar2 = fs->pc;
  pBVar8 = fs->bcbase;
  (o->str).sid = uVar2;
  bVar15 = (bVar15 & 2) >> 1;
  *(uint *)&(o->th).exdata2 = (uint)bVar14 * 0x100 + (uint)bVar15 + (uint)bVar15 * 2 + 0x59;
  uVar20 = 0;
  while (uVar20 + 1 < (ulong)uVar2) {
    *(BCIns *)((long)o + uVar20 * 4 + 0x6c) = pBVar8[uVar20 + 1].ins;
    uVar20 = uVar20 + 1;
  }
  uVar2 = fs->nkn;
  if ((uVar2 < 0x10001) && (uVar11 = fs->nkgc, uVar11 < 0x10001)) {
    (o->th).base = pTVar23;
    (o->pt).sizekn = uVar2;
    (o->pt).sizekgc = uVar11;
    pGVar9 = fs->kt;
    uVar6 = (pGVar9->array).ptr64;
    for (uVar20 = 0; uVar20 < pGVar9->asize; uVar20 = uVar20 + 1) {
      if (*(int *)(uVar6 + 4 + uVar20 * 8) == 0) {
        pTVar23[*(uint *)(uVar6 + uVar20 * 8)].n = (double)(uVar20 & 0xffffffff);
      }
    }
    uVar6 = (pGVar9->node).ptr64;
    uVar2 = pGVar9->hmask;
    for (uVar11 = 0; uVar11 <= uVar2; uVar11 = uVar11 + 1) {
      if (*(int *)(uVar6 + 4 + (ulong)uVar11 * 0x18) == 0) {
        puVar19 = (uint *)((ulong)uVar11 * 0x18 + uVar6);
        uVar20 = *(ulong *)(puVar19 + 2);
        if ((ushort)(uVar20 >> 0x30) < 0xfff9) {
          pTVar23[*puVar19].u64 = uVar20;
        }
        else {
          v = (GCobj *)(uVar20 & 0x7fffffffffff);
          pTVar23[~(ulong)*puVar19].u64 = (uint64_t)v;
          if ((((v->gch).marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
            lj_gc_barrierf((global_State *)(fs->L->glref).ptr64,o,v);
          }
          if ((*(ulong *)(puVar19 + 2) & 0xffff800000000000) == 0xfffc000000000000) {
            pVVar5 = fs->ls->vstack;
            pTVar10 = (v->th).top;
            bVar15 = (v->pt).sizeuv;
            for (uVar20 = 0; bVar15 != uVar20; uVar20 = uVar20 + 1) {
              uVar22 = *(ushort *)((long)pTVar10 + uVar20 * 2);
              uVar21 = (ulong)uVar22;
              if (uVar21 < 0xff88) {
                uVar22 = (ushort)pVVar5[uVar21].slot;
                if ((pVVar5[uVar21].info & 1) == 0) {
                  uVar22 = uVar22 | 0xc000;
                }
                else {
                  uVar22 = uVar22 | 0x8000;
                }
              }
              else {
                uVar22 = uVar22 + 0x78;
              }
              *(ushort *)((long)pTVar10 + uVar20 * 2) = uVar22;
            }
          }
        }
      }
    }
    (o->th).top = (TValue *)(lVar16 + (long)o);
    bVar15 = fs->nuv;
    (o->pt).sizeuv = bVar15;
    memcpy((TValue *)(lVar16 + (long)o),fs->uvtmp,(ulong)((uint)bVar15 * 2));
    iVar18 = fs->linedefined;
    uVar20 = (ulong)(fs->pc - 1);
    pBVar8 = fs->bcbase;
    (o->pt).firstline = iVar18;
    (o->pt).numline = uVar24;
    (o->th).cframe = (void *)(uVar27 + lVar16 + (long)o);
    if ((int)uVar24 < 0x100) {
      uVar21 = 0;
      do {
        *(char *)((long)o + uVar21 + lVar16 + uVar27) = (char)pBVar8[uVar21 + 1].line - (char)iVar18
        ;
        uVar21 = uVar21 + 1;
      } while (uVar21 < uVar20);
    }
    else if (uVar24 < 0x10000) {
      uVar21 = 0;
      do {
        *(short *)((long)o + uVar21 * 2 + lVar16 + uVar27) =
             (short)pBVar8[uVar21 + 1].line - (short)iVar18;
        uVar21 = uVar21 + 1;
      } while (uVar21 < uVar20);
    }
    else {
      uVar21 = 0;
      do {
        *(BCLine *)((long)o + uVar21 * 4 + lVar16 + uVar27) = pBVar8[uVar21 + 1].line - iVar18;
        uVar21 = uVar21 + 1;
      } while (uVar21 < uVar20);
    }
    __dest = (void *)(lVar26 + (long)o);
    *(void **)&(o->th).stacksize = __dest;
    (o->th).exdata = (void *)((uVar25 & 0xffffffff) + (long)__dest);
    pcVar28 = (ls->sb).b;
    memcpy(__dest,pcVar28,(ulong)(uint)(*(int *)&(ls->sb).w - (int)pcVar28));
    if (((*(byte *)((L->glref).ptr64 + 0x93) & 1) != 0) &&
       (argbase = lj_vmevent_prepare(L,LJ_VMEVENT_BC), argbase != 0)) {
      pTVar23 = L->top;
      L->top = pTVar23 + 1;
      pTVar23->u64 = (ulong)o | 0xfffc000000000000;
      lj_vmevent_call(L,argbase);
    }
    L->top = L->top + -1;
    ls->vtop = fs->vbase;
    ls->fs = fs->prev;
    return (GCproto *)o;
  }
  err_limit(fs,0x10000,"constants");
}

Assistant:

static GCproto *fs_finish(LexState *ls, BCLine line)
{
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  BCLine numline = line - fs->linedefined;
  size_t sizept, ofsk, ofsuv, ofsli, ofsdbg, ofsvar;
  GCproto *pt;

  /* Apply final fixups. */
  fs_fixup_ret(fs);

  /* Calculate total size of prototype including all colocated arrays. */
  sizept = sizeof(GCproto) + fs->pc*sizeof(BCIns) + fs->nkgc*sizeof(GCRef);
  sizept = (sizept + sizeof(TValue)-1) & ~(sizeof(TValue)-1);
  ofsk = sizept; sizept += fs->nkn*sizeof(TValue);
  ofsuv = sizept; sizept += ((fs->nuv+1)&~1)*2;
  ofsli = sizept; sizept += fs_prep_line(fs, numline);
  ofsdbg = sizept; sizept += fs_prep_var(ls, fs, &ofsvar);

  /* Allocate prototype and initialize its fields. */
  pt = (GCproto *)lj_mem_newgco(L, (MSize)sizept);
  pt->gct = ~LJ_TPROTO;
  pt->sizept = (MSize)sizept;
  pt->trace = 0;
  pt->flags = (uint8_t)(fs->flags & ~(PROTO_HAS_RETURN|PROTO_FIXUP_RETURN));
  pt->numparams = fs->numparams;
  pt->framesize = fs->framesize;
  setgcref(pt->chunkname, obj2gco(ls->chunkname));

  /* Close potentially uninitialized gap between bc and kgc. */
  *(uint32_t *)((char *)pt + ofsk - sizeof(GCRef)*(fs->nkgc+1)) = 0;
  fs_fixup_bc(fs, pt, (BCIns *)((char *)pt + sizeof(GCproto)), fs->pc);
  fs_fixup_k(fs, pt, (void *)((char *)pt + ofsk));
  fs_fixup_uv1(fs, pt, (uint16_t *)((char *)pt + ofsuv));
  fs_fixup_line(fs, pt, (void *)((char *)pt + ofsli), numline);
  fs_fixup_var(ls, pt, (uint8_t *)((char *)pt + ofsdbg), ofsvar);

  lj_vmevent_send(L, BC,
    setprotoV(L, L->top++, pt);
  );

  L->top--;  /* Pop table of constants. */
  ls->vtop = fs->vbase;  /* Reset variable stack. */
  ls->fs = fs->prev;
  lj_assertL(ls->fs != NULL || ls->tok == TK_eof, "bad parser state");
  return pt;
}